

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QUtf8StringView data,bool number)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  QBasicUtf8StringView<false> local_30;
  long local_20;
  
  local_30.m_size = data.m_size;
  local_30.m_data = data.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicUtf8StringView<false>::toString((QString *)&QStack_48,&local_30);
  putString(this,(QChar *)QStack_48.ptr,QStack_48.size,number);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QUtf8StringView data, bool number)
{
    putString(data.toString(), number);
}